

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void unixepochFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  int iVar1;
  long val;
  DateTime x;
  DateTime local_40;
  
  iVar1 = isDate(context,argc,argv,&local_40);
  if (iVar1 == 0) {
    computeJD(&local_40);
    if (local_40.useSubsec == '\0') {
      val = local_40.iJD / 1000 + -0x3118a36940;
      pMem = context->pOut;
      if ((pMem->flags & 0x9000) == 0) {
        (pMem->u).i = val;
        pMem->flags = 4;
      }
      else {
        vdbeReleaseAndSetInt64(pMem,val);
      }
    }
    else {
      sqlite3VdbeMemSetDouble(context->pOut,(double)(local_40.iJD + -0xbfc83e532200) / 1000.0);
    }
  }
  return;
}

Assistant:

static void unixepochFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    computeJD(&x);
    if( x.useSubsec ){
      sqlite3_result_double(context, (x.iJD - 21086676*(i64)10000000)/1000.0);
    }else{
      sqlite3_result_int64(context, x.iJD/1000 - 21086676*(i64)10000);
    }
  }
}